

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O1

void bitrv2(int n,int *ip,double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  
  uVar19 = n >> 2;
  uVar9 = 1;
  if (8 < (int)uVar19) {
    uVar9 = 1;
    uVar20 = uVar19;
    do {
      uVar9 = uVar9 * 2;
      uVar19 = uVar20 >> 2;
      bVar4 = 0x23 < uVar20;
      uVar20 = uVar19;
    } while (bVar4);
  }
  iVar18 = n >> 1;
  uVar20 = uVar9 * 4;
  uVar23 = (ulong)uVar20;
  if (uVar19 == 8) {
    if (0 < (int)uVar9) {
      iVar6 = uVar9 * 8;
      lVar21 = (long)iVar18;
      uVar7 = (ulong)uVar9;
      lVar8 = 0;
      uVar26 = 0;
      do {
        if (uVar26 != 0) {
          iVar13 = ip[uVar7 + uVar26];
          lVar24 = (long)iVar13;
          lVar16 = lVar24 << 0x21;
          lVar25 = 0;
          lVar17 = lVar21 << 0x20;
          do {
            lVar14 = (long)((int)uVar26 * 4) + (long)*(int *)((long)ip + lVar25 + uVar7 * 4) * 2;
            dVar1 = a[lVar24 * 2 + lVar25];
            dVar2 = a[lVar24 * 2 + lVar25 + 1];
            uVar19 = (uint)lVar14;
            dVar3 = a[(int)(uVar19 | 1)];
            a[lVar24 * 2 + lVar25] = a[lVar14];
            a[lVar24 * 2 + lVar25 + 1] = dVar3;
            a[lVar14] = dVar1;
            iVar10 = uVar19 + iVar6;
            a[(int)(uVar19 | 1)] = dVar2;
            dVar1 = a[lVar24 * 2 + lVar25 + uVar23];
            dVar2 = a[lVar24 * 2 + lVar25 + uVar23 + 1];
            iVar5 = uVar19 + 1 + iVar6;
            dVar3 = a[iVar5];
            a[lVar24 * 2 + lVar25 + uVar23] = a[iVar10];
            a[lVar24 * 2 + lVar25 + uVar23 + 1] = dVar3;
            a[iVar10] = dVar1;
            a[iVar5] = dVar2;
            uVar19 = iVar10 + uVar9 * -4;
            dVar1 = a[lVar24 * 2 + lVar25 + uVar23 * 2];
            dVar2 = a[lVar24 * 2 + lVar25 + uVar23 * 2 + 1];
            dVar3 = a[(int)(uVar19 | 1)];
            a[lVar24 * 2 + lVar25 + uVar23 * 2] = a[(int)uVar19];
            a[lVar24 * 2 + lVar25 + uVar23 * 2 + 1] = dVar3;
            a[(int)uVar19] = dVar1;
            a[(int)(uVar19 | 1)] = dVar2;
            dVar1 = a[lVar24 * 2 + lVar25 + uVar23 * 3];
            dVar2 = a[lVar24 * 2 + lVar25 + uVar23 * 3 + 1];
            lVar14 = (long)(int)(uVar19 + iVar6);
            iVar5 = uVar19 + 1 + iVar6;
            dVar3 = a[iVar5];
            a[lVar24 * 2 + lVar25 + uVar23 * 3] = a[lVar14];
            a[lVar24 * 2 + lVar25 + uVar23 * 3 + 1] = dVar3;
            a[lVar14] = dVar1;
            a[iVar5] = dVar2;
            dVar1 = a[lVar24 * 2 + lVar25 + uVar23 * 3 + lVar21];
            dVar2 = (a + lVar24 * 2 + lVar25 + uVar23 * 3 + lVar21)[1];
            dVar3 = (a + lVar14 + 2)[1];
            a[lVar24 * 2 + lVar25 + uVar23 * 3 + lVar21] = a[lVar14 + 2];
            (a + lVar24 * 2 + lVar25 + uVar23 * 3 + lVar21)[1] = dVar3;
            a[lVar14 + 2] = dVar1;
            (a + lVar14 + 2)[1] = dVar2;
            dVar1 = a[lVar24 * 2 + lVar25 + lVar21 + uVar23 * 2];
            dVar2 = (a + lVar24 * 2 + lVar25 + lVar21 + uVar23 * 2)[1];
            dVar3 = (a + (int)(uVar19 + 2))[1];
            a[lVar24 * 2 + lVar25 + lVar21 + uVar23 * 2] = a[(int)(uVar19 + 2)];
            (a + lVar24 * 2 + lVar25 + lVar21 + uVar23 * 2)[1] = dVar3;
            iVar10 = uVar19 + 2 + uVar20;
            a[(int)(uVar19 + 2)] = dVar1;
            (a + (int)(uVar19 + 2))[1] = dVar2;
            dVar1 = a[lVar24 * 2 + lVar25 + lVar21 + uVar23];
            dVar2 = (a + lVar24 * 2 + lVar25 + lVar21 + uVar23)[1];
            dVar3 = (a + iVar10)[1];
            a[lVar24 * 2 + lVar25 + lVar21 + uVar23] = a[iVar10];
            (a + lVar24 * 2 + lVar25 + lVar21 + uVar23)[1] = dVar3;
            iVar5 = iVar10 + uVar9 * -8;
            a[iVar10] = dVar1;
            (a + iVar10)[1] = dVar2;
            dVar1 = a[lVar24 * 2 + lVar25 + lVar21];
            dVar2 = (a + lVar24 * 2 + lVar25 + lVar21)[1];
            dVar3 = (a + iVar5)[1];
            a[lVar24 * 2 + lVar25 + lVar21] = a[iVar5];
            (a + lVar24 * 2 + lVar25 + lVar21)[1] = dVar3;
            a[iVar5] = dVar1;
            (a + iVar5)[1] = dVar2;
            dVar1 = a[lVar24 * 2 + lVar25 + lVar21 + 2];
            dVar2 = (a + lVar24 * 2 + lVar25 + lVar21 + 2)[1];
            dVar3 = (a + (iVar5 + iVar18))[1];
            a[lVar24 * 2 + lVar25 + lVar21 + 2] = a[iVar5 + iVar18];
            (a + lVar24 * 2 + lVar25 + lVar21 + 2)[1] = dVar3;
            a[iVar5 + iVar18] = dVar1;
            (a + (iVar5 + iVar18))[1] = dVar2;
            lVar15 = (long)(lVar16 + (uVar23 << 0x20) + 0x200000000 + lVar17) >> 0x1d;
            dVar1 = *(double *)((long)a + lVar15);
            lVar22 = (long)((uVar23 << 0x20) + 0x300000000 + lVar16 + lVar17) >> 0x1d;
            dVar2 = *(double *)((long)a + lVar22);
            lVar14 = (long)(iVar10 + iVar18);
            dVar3 = a[lVar14 + 1];
            *(double *)((long)a + lVar15) = a[lVar14];
            *(double *)((long)a + lVar22) = dVar3;
            a[lVar14] = dVar1;
            iVar11 = iVar18 + uVar19;
            iVar12 = iVar11 + 2;
            lVar15 = (long)((uVar23 << 0x21) + 0x200000000 + lVar16 + lVar17) >> 0x1d;
            a[lVar14 + 1] = dVar2;
            dVar1 = *(double *)((long)a + lVar15);
            lVar14 = (long)((uVar23 << 0x21) + 0x300000000 + lVar16 + lVar17) >> 0x1d;
            dVar2 = *(double *)((long)a + lVar14);
            dVar3 = a[(long)iVar12 + 1];
            *(double *)((long)a + lVar15) = a[iVar12];
            *(double *)((long)a + lVar14) = dVar3;
            a[iVar12] = dVar1;
            iVar10 = (int)lVar25;
            iVar5 = uVar9 * 0xc + iVar18 + 2 + iVar13 * 2 + iVar10;
            a[(long)iVar12 + 1] = dVar2;
            dVar1 = a[iVar5];
            lVar14 = (long)((uVar23 * 3 << 0x20) + 0x300000000 + lVar16 + lVar17) >> 0x1d;
            dVar2 = *(double *)((long)a + lVar14);
            lVar15 = (long)(iVar12 + iVar6);
            dVar3 = a[lVar15 + 1];
            a[iVar5] = a[lVar15];
            *(double *)((long)a + lVar14) = dVar3;
            a[lVar15] = dVar1;
            a[lVar15 + 1] = dVar2;
            lVar14 = (long)(int)(uVar9 * 0xc + 2 + iVar13 * 2 + iVar10);
            dVar2 = a[lVar14];
            dVar3 = (a + lVar14)[1];
            dVar1 = a[lVar15 + -1];
            a[lVar14] = a[lVar15 + -2];
            a[lVar14 + 1] = dVar1;
            a[lVar15 + -2] = dVar2;
            (a + lVar15 + -2)[1] = dVar3;
            iVar5 = uVar9 * 8 + 2 + iVar13 * 2 + iVar10;
            dVar1 = a[iVar5];
            dVar2 = (a + iVar5)[1];
            dVar3 = (a + iVar11)[1];
            a[iVar5] = a[iVar11];
            (a + iVar5)[1] = dVar3;
            a[iVar11] = dVar1;
            (a + iVar11)[1] = dVar2;
            iVar5 = uVar20 + 2 + iVar13 * 2 + iVar10;
            iVar12 = (uVar20 - 2) + iVar12;
            dVar1 = a[iVar5];
            dVar2 = (a + iVar5)[1];
            dVar3 = (a + iVar12)[1];
            a[iVar5] = a[iVar12];
            (a + iVar5)[1] = dVar3;
            a[iVar12] = dVar1;
            (a + iVar12)[1] = dVar2;
            iVar10 = iVar13 * 2 + 2 + iVar10;
            iVar12 = iVar12 + uVar9 * -8;
            dVar1 = a[iVar10];
            dVar2 = (a + iVar10)[1];
            dVar3 = (a + iVar12)[1];
            a[iVar10] = a[iVar12];
            (a + iVar10)[1] = dVar3;
            a[iVar12] = dVar1;
            (a + iVar12)[1] = dVar2;
            lVar25 = lVar25 + 4;
            lVar17 = lVar17 + 0x400000000;
          } while (lVar8 != lVar25);
        }
        iVar13 = (int)uVar26 * 4;
        lVar17 = (long)iVar13 + (long)ip[uVar7 + uVar26] * 2;
        iVar13 = iVar13 + 2 + ip[uVar7 + uVar26] * 2;
        dVar1 = a[lVar17 + 2];
        iVar5 = (int)lVar17;
        iVar10 = iVar5 + iVar18;
        dVar2 = a[(long)iVar5 + 3];
        dVar3 = a[(long)iVar10 + 1];
        a[lVar17 + 2] = a[iVar10];
        a[(long)iVar5 + 3] = dVar3;
        a[iVar10] = dVar1;
        a[(long)iVar10 + 1] = dVar2;
        iVar5 = iVar13 + uVar20;
        iVar10 = iVar10 + iVar6;
        dVar1 = a[iVar5];
        iVar13 = iVar13 + uVar20 + 1;
        dVar2 = a[iVar13];
        dVar3 = a[(long)iVar10 + 1];
        a[iVar5] = a[iVar10];
        a[iVar13] = dVar3;
        a[iVar10] = dVar1;
        a[(long)iVar10 + 1] = dVar2;
        iVar13 = iVar5 + uVar20;
        iVar10 = iVar10 + uVar9 * -4;
        dVar1 = a[iVar13];
        iVar5 = iVar5 + uVar20 + 1;
        dVar2 = a[iVar5];
        dVar3 = a[(long)iVar10 + 1];
        a[iVar13] = a[iVar10];
        a[iVar5] = dVar3;
        a[iVar10] = dVar1;
        a[(long)iVar10 + 1] = dVar2;
        dVar1 = a[(long)iVar13 + -2];
        dVar2 = (a + (long)iVar13 + -2)[1];
        dVar3 = (a + (iVar10 - iVar18))[1];
        a[(long)iVar13 + -2] = a[iVar10 - iVar18];
        (a + (long)iVar13 + -2)[1] = dVar3;
        a[iVar10 - iVar18] = dVar1;
        (a + (iVar10 - iVar18))[1] = dVar2;
        lVar17 = (long)(iVar13 + iVar18);
        dVar1 = a[lVar17];
        dVar2 = a[lVar17 + 1];
        dVar3 = a[iVar10 + 3];
        a[lVar17] = a[iVar10 + 2];
        a[lVar17 + 1] = dVar3;
        a[iVar10 + 2] = dVar1;
        a[iVar10 + 3] = dVar2;
        dVar1 = a[(int)(iVar13 + uVar20)];
        iVar5 = iVar13 + uVar20 + 1;
        dVar2 = a[iVar5];
        lVar17 = (long)(iVar10 + iVar6);
        dVar3 = a[lVar17 + 1];
        a[(int)(iVar13 + uVar20)] = a[lVar17];
        a[iVar5] = dVar3;
        a[lVar17] = dVar1;
        a[lVar17 + 1] = dVar2;
        uVar26 = uVar26 + 1;
        lVar8 = lVar8 + 4;
      } while (uVar26 != uVar7);
    }
  }
  else if (0 < (int)uVar9) {
    lVar21 = (long)iVar18;
    uVar7 = (ulong)uVar9;
    lVar8 = 0;
    uVar26 = 0;
    do {
      if (uVar26 != 0) {
        iVar6 = ip[uVar7 + uVar26];
        lVar16 = (long)iVar6;
        lVar17 = lVar21 + uVar23 + lVar16;
        lVar25 = (lVar17 << 0x20) + 0x300000000;
        lVar24 = 0;
        do {
          lVar14 = (long)*(int *)((long)ip + lVar24 + uVar7 * 4) + (long)((int)uVar26 * 4);
          dVar1 = a[lVar16 + lVar24];
          dVar2 = (a + lVar16 + lVar24)[1];
          dVar3 = (a + lVar14)[1];
          a[lVar16 + lVar24] = a[lVar14];
          (a + lVar16 + lVar24)[1] = dVar3;
          a[lVar14] = dVar1;
          (a + lVar14)[1] = dVar2;
          iVar13 = (int)lVar14;
          iVar10 = iVar13 + uVar20;
          dVar1 = a[uVar23 + lVar16 + lVar24];
          dVar2 = (a + uVar23 + lVar16 + lVar24)[1];
          dVar3 = (a + iVar10)[1];
          a[uVar23 + lVar16 + lVar24] = a[iVar10];
          (a + uVar23 + lVar16 + lVar24)[1] = dVar3;
          a[iVar10] = dVar1;
          (a + iVar10)[1] = dVar2;
          dVar2 = a[lVar17 + lVar24];
          dVar3 = (a + lVar17 + lVar24)[1];
          dVar1 = a[(long)iVar10 + 3];
          a[lVar17 + lVar24] = a[(long)iVar10 + 2];
          a[lVar17 + lVar24 + 1] = dVar1;
          a[(long)iVar10 + 2] = dVar2;
          (a + (long)iVar10 + 2)[1] = dVar3;
          dVar1 = a[lVar21 + lVar16 + lVar24];
          dVar2 = (a + lVar21 + lVar16 + lVar24)[1];
          dVar3 = (a + (iVar13 + 2))[1];
          a[lVar21 + lVar16 + lVar24] = a[iVar13 + 2];
          (a + lVar21 + lVar16 + lVar24)[1] = dVar3;
          a[iVar13 + 2] = dVar1;
          (a + (iVar13 + 2))[1] = dVar2;
          iVar5 = iVar13 + 2 + iVar18;
          dVar1 = a[lVar21 + lVar16 + lVar24 + 2];
          dVar2 = (a + lVar21 + lVar16 + lVar24 + 2)[1];
          dVar3 = (a + iVar5)[1];
          a[lVar21 + lVar16 + lVar24 + 2] = a[iVar5];
          (a + lVar21 + lVar16 + lVar24 + 2)[1] = dVar3;
          a[iVar5] = dVar1;
          (a + iVar5)[1] = dVar2;
          iVar5 = (int)lVar24;
          iVar11 = uVar20 + 2 + iVar18 + iVar6 + iVar5;
          dVar1 = a[iVar11];
          dVar2 = *(double *)((long)a + (lVar25 >> 0x1d));
          lVar14 = (long)(iVar18 + 2 + iVar10);
          dVar3 = a[lVar14 + 1];
          a[iVar11] = a[lVar14];
          *(double *)((long)a + (lVar25 >> 0x1d)) = dVar3;
          a[lVar14] = dVar1;
          a[lVar14 + 1] = dVar2;
          iVar11 = uVar20 + 2 + iVar6 + iVar5;
          dVar1 = a[iVar11];
          dVar2 = (a + iVar11)[1];
          dVar3 = (a + (iVar10 + iVar18))[1];
          a[iVar11] = a[iVar10 + iVar18];
          (a + iVar11)[1] = dVar3;
          a[iVar10 + iVar18] = dVar1;
          (a + (iVar10 + iVar18))[1] = dVar2;
          iVar5 = iVar6 + 2 + iVar5;
          dVar1 = a[iVar5];
          dVar2 = (a + iVar5)[1];
          dVar3 = (a + (iVar18 + iVar13))[1];
          a[iVar5] = a[iVar18 + iVar13];
          (a + iVar5)[1] = dVar3;
          a[iVar18 + iVar13] = dVar1;
          (a + (iVar18 + iVar13))[1] = dVar2;
          lVar24 = lVar24 + 4;
          lVar25 = lVar25 + 0x400000000;
        } while (lVar8 != lVar24);
      }
      iVar6 = ip[uVar7 + uVar26];
      iVar13 = (int)uVar26 * 4;
      lVar17 = (long)iVar6 + (long)iVar13;
      dVar1 = a[lVar17 + 2];
      iVar5 = (int)lVar17;
      iVar10 = iVar5 + iVar18;
      dVar2 = a[(long)iVar5 + 3];
      dVar3 = a[(long)iVar10 + 1];
      a[lVar17 + 2] = a[iVar10];
      a[(long)iVar5 + 3] = dVar3;
      a[iVar10] = dVar1;
      a[(long)iVar10 + 1] = dVar2;
      iVar6 = iVar6 + 2 + iVar13 + uVar20;
      dVar1 = a[iVar6];
      dVar2 = (a + iVar6)[1];
      dVar3 = (a + (int)(iVar10 + uVar20))[1];
      a[iVar6] = a[(int)(iVar10 + uVar20)];
      (a + iVar6)[1] = dVar3;
      a[(int)(iVar10 + uVar20)] = dVar1;
      (a + (int)(iVar10 + uVar20))[1] = dVar2;
      uVar26 = uVar26 + 1;
      lVar8 = lVar8 + 4;
    } while (uVar26 != uVar7);
  }
  return;
}

Assistant:

void bitrv2(int n, int *ip, double *a) {
  int j, j1, k, k1, l, m, nh, nm;
  double xr, xi, yr, yi;

  m = 1;
  for (l = n >> 2; l > 8; l >>= 2) {
    m <<= 1;
  }
  nh = n >> 1;
  nm = 4 * m;
  if (l == 8) {
    for (k = 0; k < m; k++) {
      for (j = 0; j < k; j++) {
        j1 = 4 * j + 2 * ip[m + k];
        k1 = 4 * k + 2 * ip[m + j];
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nh;
        k1 += 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += 2;
        k1 += nh;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nh;
        k1 -= 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
      }
      k1 = 4 * k + 2 * ip[m + k];
      j1 = k1 + 2;
      k1 += nh;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nm;
      k1 += 2 * nm;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nm;
      k1 -= nm;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 -= 2;
      k1 -= nh;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nh + 2;
      k1 += nh + 2;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 -= nh - nm;
      k1 += 2 * nm - 2;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
    }
  } else {
    for (k = 0; k < m; k++) {
      for (j = 0; j < k; j++) {
        j1 = 4 * j + ip[m + k];
        k1 = 4 * k + ip[m + j];
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nh;
        k1 += 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += 2;
        k1 += nh;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nh;
        k1 -= 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
      }
      k1 = 4 * k + ip[m + k];
      j1 = k1 + 2;
      k1 += nh;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nm;
      k1 += nm;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
    }
  }
}